

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.hh
# Opt level: O2

void __thiscall Pipeline::~Pipeline(Pipeline *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Pipeline() = default;